

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyConcaveCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
btSoftBodyTriangleCallback::btSoftBodyTriangleCallback
          (btSoftBodyTriangleCallback *this,btDispatcher *dispatcher,
          btCollisionObjectWrapper *body0Wrap,btCollisionObjectWrapper *body1Wrap,bool isSwapped)

{
  btCollisionObjectWrapper *pbVar1;
  undefined3 in_register_00000081;
  
  (this->super_btTriangleCallback)._vptr_btTriangleCallback =
       (_func_int **)&PTR__btSoftBodyTriangleCallback_002218b0;
  this->m_dispatcher = dispatcher;
  this->m_dispatchInfoPtr = (btDispatcherInfo *)0x0;
  (this->m_shapeCache).m_hashTable.m_ownsMemory = true;
  (this->m_shapeCache).m_hashTable.m_data = (int *)0x0;
  (this->m_shapeCache).m_hashTable.m_size = 0;
  (this->m_shapeCache).m_hashTable.m_capacity = 0;
  (this->m_shapeCache).m_next.m_ownsMemory = true;
  (this->m_shapeCache).m_next.m_data = (int *)0x0;
  (this->m_shapeCache).m_next.m_size = 0;
  (this->m_shapeCache).m_next.m_capacity = 0;
  (this->m_shapeCache).m_valueArray.m_ownsMemory = true;
  (this->m_shapeCache).m_valueArray.m_data = (btTriIndex *)0x0;
  (this->m_shapeCache).m_valueArray.m_size = 0;
  (this->m_shapeCache).m_valueArray.m_capacity = 0;
  (this->m_shapeCache).m_keyArray.m_ownsMemory = true;
  (this->m_shapeCache).m_keyArray.m_data = (btHashKey<btTriIndex> *)0x0;
  (this->m_shapeCache).m_keyArray.m_size = 0;
  (this->m_shapeCache).m_keyArray.m_capacity = 0;
  pbVar1 = body1Wrap;
  if (CONCAT31(in_register_00000081,isSwapped) != 0) {
    pbVar1 = body0Wrap;
    body0Wrap = body1Wrap;
  }
  this->m_softBody = (btSoftBody *)body0Wrap->m_collisionObject;
  this->m_triBody = pbVar1->m_collisionObject;
  clearCache(this);
  return;
}

Assistant:

btSoftBodyTriangleCallback::btSoftBodyTriangleCallback(btDispatcher*  dispatcher,const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap,bool isSwapped):
m_dispatcher(dispatcher),
m_dispatchInfoPtr(0)
{
	m_softBody = (isSwapped? (btSoftBody*)body1Wrap->getCollisionObject():(btSoftBody*)body0Wrap->getCollisionObject());
	m_triBody = isSwapped? body0Wrap->getCollisionObject():body1Wrap->getCollisionObject();

	//
	// create the manifold from the dispatcher 'manifold pool'
	//
	//	  m_manifoldPtr = m_dispatcher->getNewManifold(m_convexBody,m_triBody);

	clearCache();
}